

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::Builder::getMemberElementPtr
          (Builder *this,shared_ptr<mocker::ir::Addr> *base,string *className,string *varName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *hint;
  long *plVar2;
  size_t sVar3;
  element_type *peVar4;
  size_type *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  string *in_R8;
  shared_ptr<mocker::ir::Reg> sVar7;
  shared_ptr<mocker::ir::IntLiteral> offsetLit;
  shared_ptr<mocker::ir::AttachedComment> attachedComment;
  undefined1 local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  shared_ptr<mocker::ir::IntLiteral> local_a8;
  element_type local_98;
  AttachedComment *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  string *local_70;
  shared_ptr<mocker::ir::IRInst> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70 = className;
  std::operator+(&local_50,"getElementPtr: ",varName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  peVar4 = (element_type *)(plVar2 + 2);
  if ((element_type *)*plVar2 == peVar4) {
    local_98.super_Addr._vptr_Addr = (peVar4->super_Addr)._vptr_Addr;
    local_98.val = plVar2[3];
    local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_98;
  }
  else {
    local_98.super_Addr._vptr_Addr = (peVar4->super_Addr)._vptr_Addr;
    local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar2;
  }
  local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
  *plVar2 = (long)peVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a8,(ulong)(in_R8->_M_dataplus)._M_p);
  paVar1 = &local_c8.field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_c8.field_2._M_allocated_capacity = *psVar5;
    local_c8.field_2._8_8_ = plVar2[3];
    local_c8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar5;
    local_c8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_c8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_88 = (AttachedComment *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::AttachedComment,std::allocator<mocker::ir::AttachedComment>,std::__cxx11::string>
            (a_Stack_80,&local_88,(allocator<mocker::ir::AttachedComment> *)&local_c9,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &local_98) {
    operator_delete(local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_98.super_Addr._vptr_Addr + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_88->super_IRInst;
  local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_80[0]._M_pi;
  local_88 = (AttachedComment *)0x0;
  a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BuilderContext::appendInst
            ((BuilderContext *)
             (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,&local_68);
  if (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  sVar3 = BuilderContext::getOffset
                    ((BuilderContext *)
                     (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi,varName,in_R8);
  local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_M_use_count = 1;
  (local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_M_weak_count = 1;
  (local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
  local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
  local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_use_count = (int)sVar3;
  local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_weak_count = (int)(sVar3 >> 0x20);
  hint = (string *)
         (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"varPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)this,hint);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p._0_4_ = 5;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::IntLiteral>&>
            ((BuilderContext *)
             (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,(shared_ptr<mocker::ir::Reg> *)this,(OpType *)&local_c8,
             (shared_ptr<mocker::ir::Addr> *)local_70,&local_a8);
  _Var6._M_pi = extraout_RDX;
  if (local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (a_Stack_80[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_80[0]._M_pi);
    _Var6._M_pi = extraout_RDX_01;
  }
  sVar7.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar7.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg>
Builder::getMemberElementPtr(const std::shared_ptr<Addr> &base,
                             const std::string &className,
                             const std::string &varName) const {
  auto attachedComment = std::make_shared<AttachedComment>(
      "getElementPtr: " + className + "::" + varName);
  ctx.appendInst(std::move(attachedComment));

  std::size_t offset = ctx.getOffset(className, varName);
  auto offsetLit = std::make_shared<IntLiteral>((Integer)offset);
  auto varPtr = ctx.makeTempLocalReg("varPtr");
  ctx.emplaceInst<ArithBinaryInst>(varPtr, ArithBinaryInst::Add, base,
                                   offsetLit);
  return varPtr;
}